

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

int IoTHubTransport_AMQP_Common_Device_SetOption
              (TRANSPORT_LL_HANDLE handle,char *option,void *value)

{
  int iVar1;
  char *name;
  LOGGER_LOG p_Var2;
  undefined8 *puVar3;
  char *local_80;
  LOGGER_LOG l_2;
  char *device_id;
  LOGGER_LOG l_1;
  AMQP_TRANSPORT_DEVICE_INSTANCE *registered_device;
  LIST_ITEM_HANDLE list_item;
  AMQP_TRANSPORT_INSTANCE *instance;
  LOGGER_LOG l;
  char *device_option;
  int result;
  void *value_local;
  char *option_local;
  TRANSPORT_LL_HANDLE handle_local;
  
  name = get_device_option_name_from(option);
  if (name == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                ,"IoTHubTransport_AMQP_Common_Device_SetOption",0x4b3,1,
                "failed setting option \'%s\' to registered device (could not match name to options supported by device)"
                ,option);
    }
    device_option._4_4_ = 0x4b4;
  }
  else {
    device_option._4_4_ = 0;
    for (registered_device =
              (AMQP_TRANSPORT_DEVICE_INSTANCE *)
              singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)handle + 0x28));
        registered_device != (AMQP_TRANSPORT_DEVICE_INSTANCE *)0x0;
        registered_device =
             (AMQP_TRANSPORT_DEVICE_INSTANCE *)
             singlylinkedlist_get_next_item((LIST_ITEM_HANDLE)registered_device)) {
      puVar3 = (undefined8 *)singlylinkedlist_item_get_value((LIST_ITEM_HANDLE)registered_device);
      if (puVar3 == (undefined8 *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                    ,"IoTHubTransport_AMQP_Common_Device_SetOption",0x4c3,1,
                    "failed setting option \'%s\' to registered device (singlylinkedlist_item_get_value failed)"
                    ,option);
        }
        return 0x4c4;
      }
      iVar1 = amqp_device_set_option((AMQP_DEVICE_HANDLE)puVar3[1],name,value);
      if (iVar1 != 0) {
        local_80 = STRING_c_str((STRING_HANDLE)*puVar3);
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          if (local_80 == (char *)0x0) {
            local_80 = "NULL";
          }
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_common.c"
                    ,"IoTHubTransport_AMQP_Common_Device_SetOption",0x4cb,1,
                    "failed setting option \'%s\' to registered device \'%s\' (amqp_device_set_option failed)"
                    ,option,local_80);
        }
        return 0x4cc;
      }
    }
  }
  return device_option._4_4_;
}

Assistant:

static int IoTHubTransport_AMQP_Common_Device_SetOption(TRANSPORT_LL_HANDLE handle, const char* option, void* value)
{
    int result;
    const char* device_option;

    if ((device_option = get_device_option_name_from(option)) == NULL)
    {
        LogError("failed setting option '%s' to registered device (could not match name to options supported by device)", option);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_TRANSPORT_INSTANCE* instance = (AMQP_TRANSPORT_INSTANCE*)handle;
        result = RESULT_OK;

        LIST_ITEM_HANDLE list_item = singlylinkedlist_get_head_item(instance->registered_devices);

        while (list_item != NULL)
        {
            AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device;

            if ((registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)singlylinkedlist_item_get_value(list_item)) == NULL)
            {
                LogError("failed setting option '%s' to registered device (singlylinkedlist_item_get_value failed)", option);
                result = MU_FAILURE;
                break;
            }
            else if (amqp_device_set_option(registered_device->device_handle, device_option, value) != RESULT_OK)
            {
                const char* device_id = STRING_c_str(registered_device->device_id); // advoid MU_P_OR_NULL double call
                LogError("failed setting option '%s' to registered device '%s' (amqp_device_set_option failed)",
                    option, MU_P_OR_NULL(device_id));
                result = MU_FAILURE;
                break;
            }

            list_item = singlylinkedlist_get_next_item(list_item);
        }
    }

    return result;
}